

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax
          (GenerateBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          NamedLabelSyntax *label,Token begin,NamedBlockClauseSyntax *beginName,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token end,NamedBlockClauseSyntax *endName
          )

{
  bool bVar1;
  reference ppMVar2;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  MemberSyntax *in_R9;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_ffffffffffffff98;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            (in_R9,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             in_stack_ffffffffffffffc0._M_current);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = &in_R9->super_SyntaxNode;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff98);
  *(_func_int ***)(in_RDI + 7) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[7].previewNode = (SyntaxNode *)__end2._M_current;
  if (in_RDI[3].parent != (SyntaxNode *)0x0) {
    (in_RDI[3].parent)->parent = in_RDI;
  }
  if (in_RDI[4].parent != (SyntaxNode *)0x0) {
    (in_RDI[4].parent)->parent = in_RDI;
  }
  in_RDI[5].parent = in_RDI;
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff98);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffc0);
    ((*ppMVar2)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffc0);
  }
  if (in_RDI[7].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[7].previewNode)->parent = in_RDI;
  }
  return;
}

Assistant:

GenerateBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NamedLabelSyntax* label, Token begin, NamedBlockClauseSyntax* beginName, const SyntaxList<MemberSyntax>& members, Token end, NamedBlockClauseSyntax* endName) :
        MemberSyntax(SyntaxKind::GenerateBlock, attributes), label(label), begin(begin), beginName(beginName), members(members), end(end), endName(endName) {
        if (this->label) this->label->parent = this;
        if (this->beginName) this->beginName->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endName) this->endName->parent = this;
    }